

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSwap.cpp
# Opt level: O0

int __thiscall
NaPNSwapper::verify(NaPNSwapper *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
                   size_t tbslen)

{
  int iVar1;
  int iVar2;
  NaVector *pNVar3;
  ulong uVar4;
  bool local_9;
  
  pNVar3 = NaPetriCnOutput::data(&this->out);
  iVar1 = (*pNVar3->_vptr_NaVector[6])();
  pNVar3 = NaPetriCnInput::data((NaPetriCnInput *)this);
  iVar2 = (*pNVar3->_vptr_NaVector[6])();
  uVar4 = 0;
  local_9 = false;
  if (iVar1 == iVar2) {
    pNVar3 = NaPetriCnInput::data((NaPetriCnInput *)this);
    iVar1 = (*pNVar3->_vptr_NaVector[6])();
    pNVar3 = NaPetriCnInput::data((NaPetriCnInput *)this);
    iVar2 = (*pNVar3->_vptr_NaVector[6])();
    uVar4 = 0;
    local_9 = false;
    if (iVar1 == iVar2) {
      pNVar3 = NaPetriCnOutput::data(&this->out2);
      iVar1 = (*pNVar3->_vptr_NaVector[6])();
      pNVar3 = NaPetriCnInput::data((NaPetriCnInput *)this);
      iVar2 = (*pNVar3->_vptr_NaVector[6])();
      uVar4 = 0;
      local_9 = false;
      if (iVar1 == iVar2) {
        pNVar3 = NaPetriCnInput::data((NaPetriCnInput *)this);
        iVar1 = (*pNVar3->_vptr_NaVector[6])();
        local_9 = iVar1 == 1;
        uVar4 = (ulong)CONCAT31((int3)((uint)iVar1 >> 8),local_9);
      }
    }
  }
  return (int)CONCAT71((int7)(uVar4 >> 8),local_9);
}

Assistant:

bool
NaPNSwapper::verify ()
{
    return out.data().dim() == in.data().dim()
        && in2.data().dim() == in.data().dim()
        && out2.data().dim() == in2.data().dim()
        && turn.data().dim() == 1;
}